

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  size_t __size;
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  unsigned_short *puVar11;
  uchar *puVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int *__s;
  int *piVar16;
  int *__s_00;
  uchar *puVar17;
  uchar *puVar18;
  uint *puVar19;
  uint *puVar20;
  uint *puVar21;
  unsigned_short uVar22;
  ulong uVar23;
  ulong uVar24;
  size_t sVar25;
  LodePNGCompressSettings *pLVar26;
  size_t sVar27;
  ulong insize_00;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  size_t sVar33;
  ulong uVar34;
  int iVar35;
  ulong inpos;
  long lVar36;
  long lVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar70;
  int iVar75;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar84;
  int iVar85;
  undefined1 auVar83 [16];
  int iVar86;
  ucvector local_228;
  uint *local_210;
  uchar *local_208;
  size_t local_200;
  undefined1 local_1f8 [16];
  size_t local_1e8;
  size_t local_1d8;
  ulong local_1d0;
  uchar *local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  LodePNGCompressSettings *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  uint *local_190;
  uint *local_188;
  ulong *local_180;
  HuffmanTree tree_ll;
  undefined1 local_158 [32];
  undefined1 local_138 [16];
  size_t local_128;
  HuffmanTree tree_d;
  HuffmanTree tree_cl;
  undefined1 local_c8 [16];
  size_t local_b8;
  unsigned_short *local_b0;
  ulong local_a8;
  int *local_a0;
  unsigned_short *local_98;
  unsigned_short *local_90;
  undefined1 local_88 [16];
  size_t local_78;
  uint *local_70;
  int *local_68;
  Hash local_60;
  
  local_228.data = *out;
  local_228.size = *outsize;
  local_1d8 = 0;
  uVar13 = settings->btype;
  uVar14 = 0x3d;
  if (uVar13 < 3) {
    local_1c0 = insize;
    local_228.allocsize = local_228.size;
    local_208 = in;
    local_200 = insize;
    local_180 = outsize;
    if (uVar13 != 1) {
      if (uVar13 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar14 = 0;
        }
        else {
          uVar32 = (insize + 0xfffe) / 0xffff;
          uVar29 = uVar32 - 1;
          local_1a0 = 0;
          auVar8._12_4_ = 0;
          auVar8._0_12_ = local_158._4_12_;
          local_158._0_16_ = auVar8 << 0x20;
          local_1c0 = uVar32;
          do {
            sVar33 = local_228.allocsize;
            sVar25 = local_228.size;
            puVar18 = local_228.data;
            uVar23 = local_228.size + 1;
            puVar17 = local_228.data;
            uVar28 = local_228.allocsize;
            if (local_228.allocsize < uVar23) {
              uVar28 = uVar23 * 3 >> 1;
              if (local_228.allocsize * 2 < uVar23) {
                uVar28 = uVar23;
              }
              puVar17 = (uchar *)realloc(local_228.data,uVar28);
              insize = local_200;
              uVar24 = uVar23;
              in = local_208;
              if (puVar17 != (uchar *)0x0) goto LAB_001a496f;
            }
            else {
LAB_001a496f:
              local_228.allocsize = uVar28;
              local_228.data = puVar17;
              local_228.data[sVar25] = local_1a0 == uVar29;
              uVar24 = sVar25 + 2;
              puVar18 = local_228.data;
              sVar33 = local_228.allocsize;
              local_228.size = uVar23;
            }
            local_1d0 = (ulong)(uint)local_158._0_4_;
            iVar70 = (int)insize - local_158._0_4_;
            if (0xfffe < insize - local_1d0) {
              iVar70 = 0xffff;
            }
            puVar17 = puVar18;
            puVar12 = local_228.data;
            uVar23 = local_228.allocsize;
            if (sVar33 < uVar24) {
              uVar23 = uVar24 * 3 >> 1;
              if (sVar33 * 2 < uVar24) {
                uVar23 = uVar24;
              }
              puVar17 = (uchar *)realloc(puVar18,uVar23);
              insize = local_200;
              uVar28 = uVar24;
              in = local_208;
              puVar12 = puVar17;
              if (puVar17 != (uchar *)0x0) goto LAB_001a4a12;
            }
            else {
LAB_001a4a12:
              local_228.allocsize = uVar23;
              local_228.data = puVar12;
              puVar17[uVar24 - 1] = (uchar)iVar70;
              uVar28 = uVar24 + 1;
              puVar18 = local_228.data;
              sVar33 = local_228.allocsize;
              local_228.size = uVar24;
            }
            puVar17 = puVar18;
            puVar12 = local_228.data;
            uVar23 = local_228.allocsize;
            if (sVar33 < uVar28) {
              uVar23 = uVar28 * 3 >> 1;
              if (sVar33 * 2 < uVar28) {
                uVar23 = uVar28;
              }
              puVar17 = (uchar *)realloc(puVar18,uVar23);
              insize = local_200;
              uVar24 = uVar28;
              in = local_208;
              puVar12 = puVar17;
              if (puVar17 != (uchar *)0x0) goto LAB_001a4a7c;
            }
            else {
LAB_001a4a7c:
              local_228.allocsize = uVar23;
              local_228.data = puVar12;
              puVar17[uVar28 - 1] = (uchar)((uint)iVar70 >> 8);
              uVar24 = uVar28 + 1;
              puVar18 = local_228.data;
              sVar33 = local_228.allocsize;
              local_228.size = uVar28;
            }
            puVar17 = puVar18;
            puVar12 = local_228.data;
            uVar23 = local_228.allocsize;
            if (sVar33 < uVar24) {
              uVar23 = uVar24 * 3 >> 1;
              if (sVar33 * 2 < uVar24) {
                uVar23 = uVar24;
              }
              puVar17 = (uchar *)realloc(puVar18,uVar23);
              insize = local_200;
              uVar28 = uVar24;
              in = local_208;
              puVar12 = puVar17;
              if (puVar17 != (uchar *)0x0) goto LAB_001a4aed;
            }
            else {
LAB_001a4aed:
              local_228.allocsize = uVar23;
              local_228.data = puVar12;
              puVar17[uVar24 - 1] = (uchar)(0xffff - iVar70);
              uVar28 = uVar24 + 1;
              puVar18 = local_228.data;
              sVar33 = local_228.allocsize;
              local_228.size = uVar24;
            }
            puVar17 = local_228.data;
            uVar23 = local_228.allocsize;
            if (sVar33 < uVar28) {
              uVar23 = uVar28 * 3 >> 1;
              if (sVar33 * 2 < uVar28) {
                uVar23 = uVar28;
              }
              puVar18 = (uchar *)realloc(puVar18,uVar23);
              insize = local_200;
              in = local_208;
              puVar17 = puVar18;
              if (puVar18 != (uchar *)0x0) goto LAB_001a4b4e;
            }
            else {
LAB_001a4b4e:
              local_228.allocsize = uVar23;
              local_228.data = puVar17;
              puVar18[uVar28 - 1] = (uchar)((uint)(0xffff - iVar70) >> 8);
              local_228.size = uVar28;
            }
            if (local_1d0 < insize) {
              uVar32 = local_1d0;
              uVar23 = local_1d0;
              sVar25 = local_228.allocsize;
              puVar18 = local_228.data;
              uVar28 = local_228.size;
              uVar24 = 0;
              do {
                uVar1 = in[uVar32];
                uVar32 = uVar28 + 1;
                puVar17 = puVar18;
                uVar34 = sVar25;
                if (sVar25 < uVar32) {
                  uVar34 = uVar32 * 3 >> 1;
                  if (sVar25 * 2 < uVar32) {
                    uVar34 = uVar32;
                  }
                  local_158._0_8_ = sVar25;
                  puVar17 = (uchar *)realloc(puVar18,uVar34);
                  insize = local_200;
                  uVar23 = local_1d0;
                  in = local_208;
                  if (puVar17 != (uchar *)0x0) goto LAB_001a4bd1;
                }
                else {
LAB_001a4bd1:
                  sVar25 = uVar34;
                  puVar17[uVar28] = uVar1;
                  puVar18 = puVar17;
                  uVar28 = uVar32;
                }
                uVar34 = uVar24 + 1;
              } while ((uVar24 < 0xfffe) &&
                      (uVar32 = (ulong)((int)uVar23 + (int)uVar24 + 1), uVar24 = uVar34,
                      uVar32 < insize));
              local_158._0_4_ = (int)uVar23 + (int)uVar34;
              uVar32 = local_1c0;
              local_228.data = puVar18;
              local_228.size = uVar28;
              local_228.allocsize = sVar25;
            }
            local_1a0 = local_1a0 + 1;
          } while (local_1a0 != uVar32);
          uVar14 = 0;
          outsize = local_180;
        }
        goto LAB_001a5bc5;
      }
      uVar29 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar29 = insize >> 3;
      }
      if (0x3fff7 < uVar29) {
        uVar29 = 0x3fff8;
      }
      local_1c0 = uVar29 + 8;
    }
    local_1a8 = 1;
    if (!CARRY8(insize - 1,local_1c0)) {
      local_1a8 = ((insize - 1) + local_1c0) / local_1c0;
    }
    uVar29 = (ulong)settings->windowsize;
    local_1b0 = settings;
    __s = (int *)malloc(0x40000);
    local_60.head = __s;
    piVar16 = (int *)malloc(uVar29 * 4);
    __size = uVar29 * 2;
    local_60.val = piVar16;
    local_90 = (unsigned_short *)malloc(__size);
    local_60.chain = local_90;
    local_98 = (unsigned_short *)malloc(__size);
    local_60.zeros = local_98;
    __s_00 = (int *)malloc(0x40c);
    local_60.headz = __s_00;
    local_b0 = (unsigned_short *)malloc(__size);
    puVar11 = local_90;
    uVar14 = 0x53;
    outsize = local_180;
    if (((((piVar16 != (int *)0x0) && (__s != (int *)0x0)) && (local_90 != (unsigned_short *)0x0))
        && ((local_98 != (unsigned_short *)0x0 && (__s_00 != (int *)0x0)))) &&
       (local_b0 != (unsigned_short *)0x0)) {
      local_a0 = piVar16;
      local_60.chainz = local_b0;
      memset(__s,0xff,0x40000);
      local_68 = __s;
      if (uVar29 == 0) {
        memset(__s_00,0xff,0x40c);
        uVar32 = local_1c0;
      }
      else {
        memset(local_a0,0xff,uVar29 * 4);
        uVar32 = local_1c0;
        auVar8 = _DAT_001e4dd0;
        lVar37 = uVar29 - 1;
        auVar83._8_4_ = (int)lVar37;
        auVar83._0_8_ = lVar37;
        auVar83._12_4_ = (int)((ulong)lVar37 >> 0x20);
        uVar23 = 0;
        auVar83 = auVar83 ^ _DAT_001e4dd0;
        auVar52 = _DAT_001e6160;
        auVar78 = _DAT_001e6170;
        auVar82 = _DAT_001e6180;
        auVar56 = _DAT_001e6120;
        do {
          auVar43 = auVar56 ^ auVar8;
          iVar35 = auVar83._0_4_;
          iVar70 = -(uint)(iVar35 < auVar43._0_4_);
          iVar84 = auVar83._4_4_;
          auVar44._4_4_ = -(uint)(iVar84 < auVar43._4_4_);
          iVar85 = auVar83._8_4_;
          iVar75 = -(uint)(iVar85 < auVar43._8_4_);
          iVar86 = auVar83._12_4_;
          auVar44._12_4_ = -(uint)(iVar86 < auVar43._12_4_);
          auVar63._4_4_ = iVar70;
          auVar63._0_4_ = iVar70;
          auVar63._8_4_ = iVar75;
          auVar63._12_4_ = iVar75;
          auVar76 = pshuflw(in_XMM8,auVar63,0xe8);
          auVar46._4_4_ = -(uint)(auVar43._4_4_ == iVar84);
          auVar46._12_4_ = -(uint)(auVar43._12_4_ == iVar86);
          auVar46._0_4_ = auVar46._4_4_;
          auVar46._8_4_ = auVar46._12_4_;
          auVar81 = pshuflw(in_XMM9,auVar46,0xe8);
          auVar44._0_4_ = auVar44._4_4_;
          auVar44._8_4_ = auVar44._12_4_;
          auVar77 = pshuflw(auVar76,auVar44,0xe8);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar77 | auVar81 & auVar76) ^ auVar43;
          auVar43 = packssdw(auVar43,auVar43);
          uVar22 = (unsigned_short)uVar23;
          if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar11[uVar23] = uVar22;
          }
          auVar44 = auVar46 & auVar63 | auVar44;
          auVar43 = packssdw(auVar44,auVar44);
          auVar77._8_4_ = 0xffffffff;
          auVar77._0_8_ = 0xffffffffffffffff;
          auVar77._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar77,auVar43 ^ auVar77);
          if ((auVar43._0_4_ >> 0x10 & 1) != 0) {
            puVar11[uVar23 + 1] = uVar22 + 1;
          }
          auVar43 = auVar82 ^ auVar8;
          iVar70 = -(uint)(iVar35 < auVar43._0_4_);
          auVar71._4_4_ = -(uint)(iVar84 < auVar43._4_4_);
          iVar75 = -(uint)(iVar85 < auVar43._8_4_);
          auVar71._12_4_ = -(uint)(iVar86 < auVar43._12_4_);
          auVar45._4_4_ = iVar70;
          auVar45._0_4_ = iVar70;
          auVar45._8_4_ = iVar75;
          auVar45._12_4_ = iVar75;
          auVar62._4_4_ = -(uint)(auVar43._4_4_ == iVar84);
          auVar62._12_4_ = -(uint)(auVar43._12_4_ == iVar86);
          auVar62._0_4_ = auVar62._4_4_;
          auVar62._8_4_ = auVar62._12_4_;
          auVar71._0_4_ = auVar71._4_4_;
          auVar71._8_4_ = auVar71._12_4_;
          auVar43 = auVar62 & auVar45 | auVar71;
          auVar43 = packssdw(auVar43,auVar43);
          auVar2._8_4_ = 0xffffffff;
          auVar2._0_8_ = 0xffffffffffffffff;
          auVar2._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar2,auVar43 ^ auVar2);
          if ((auVar43 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar11[uVar23 + 2] = uVar22 + 2;
          }
          auVar46 = pshufhw(auVar45,auVar45,0x84);
          auVar63 = pshufhw(auVar62,auVar62,0x84);
          auVar44 = pshufhw(auVar46,auVar71,0x84);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar44 | auVar63 & auVar46) ^ auVar47;
          auVar46 = packssdw(auVar47,auVar47);
          if ((auVar46 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar11[uVar23 + 3] = uVar22 + 3;
          }
          auVar46 = auVar78 ^ auVar8;
          iVar70 = -(uint)(iVar35 < auVar46._0_4_);
          auVar49._4_4_ = -(uint)(iVar84 < auVar46._4_4_);
          iVar75 = -(uint)(iVar85 < auVar46._8_4_);
          auVar49._12_4_ = -(uint)(iVar86 < auVar46._12_4_);
          auVar64._4_4_ = iVar70;
          auVar64._0_4_ = iVar70;
          auVar64._8_4_ = iVar75;
          auVar64._12_4_ = iVar75;
          auVar43 = pshuflw(auVar43,auVar64,0xe8);
          auVar48._4_4_ = -(uint)(auVar46._4_4_ == iVar84);
          auVar48._12_4_ = -(uint)(auVar46._12_4_ == iVar86);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          in_XMM9 = pshuflw(auVar81 & auVar76,auVar48,0xe8);
          in_XMM9 = in_XMM9 & auVar43;
          auVar49._0_4_ = auVar49._4_4_;
          auVar49._8_4_ = auVar49._12_4_;
          auVar43 = pshuflw(auVar43,auVar49,0xe8);
          auVar76._8_4_ = 0xffffffff;
          auVar76._0_8_ = 0xffffffffffffffff;
          auVar76._12_4_ = 0xffffffff;
          auVar76 = (auVar43 | in_XMM9) ^ auVar76;
          auVar43 = packssdw(auVar76,auVar76);
          if ((auVar43 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar11[uVar23 + 4] = uVar22 + 4;
          }
          auVar49 = auVar48 & auVar64 | auVar49;
          auVar43 = packssdw(auVar49,auVar49);
          auVar81._8_4_ = 0xffffffff;
          auVar81._0_8_ = 0xffffffffffffffff;
          auVar81._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar81,auVar43 ^ auVar81);
          if ((auVar43 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar11[uVar23 + 5] = uVar22 + 5;
          }
          auVar43 = auVar52 ^ auVar8;
          iVar70 = -(uint)(iVar35 < auVar43._0_4_);
          auVar72._4_4_ = -(uint)(iVar84 < auVar43._4_4_);
          iVar75 = -(uint)(iVar85 < auVar43._8_4_);
          auVar72._12_4_ = -(uint)(iVar86 < auVar43._12_4_);
          auVar50._4_4_ = iVar70;
          auVar50._0_4_ = iVar70;
          auVar50._8_4_ = iVar75;
          auVar50._12_4_ = iVar75;
          auVar65._4_4_ = -(uint)(auVar43._4_4_ == iVar84);
          auVar65._12_4_ = -(uint)(auVar43._12_4_ == iVar86);
          auVar65._0_4_ = auVar65._4_4_;
          auVar65._8_4_ = auVar65._12_4_;
          auVar72._0_4_ = auVar72._4_4_;
          auVar72._8_4_ = auVar72._12_4_;
          auVar43 = auVar65 & auVar50 | auVar72;
          auVar43 = packssdw(auVar43,auVar43);
          auVar3._8_4_ = 0xffffffff;
          auVar3._0_8_ = 0xffffffffffffffff;
          auVar3._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar43 ^ auVar3,auVar43 ^ auVar3);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar11[uVar23 + 6] = uVar22 + 6;
          }
          auVar43 = pshufhw(auVar50,auVar50,0x84);
          auVar44 = pshufhw(auVar65,auVar65,0x84);
          auVar46 = pshufhw(auVar43,auVar72,0x84);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar46 | auVar44 & auVar43) ^ auVar51;
          auVar43 = packssdw(auVar51,auVar51);
          if ((auVar43 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar11[uVar23 + 7] = uVar22 + 7;
          }
          uVar23 = uVar23 + 8;
          lVar37 = auVar56._8_8_;
          auVar56._0_8_ = auVar56._0_8_ + 8;
          auVar56._8_8_ = lVar37 + 8;
          lVar37 = auVar82._8_8_;
          auVar82._0_8_ = auVar82._0_8_ + 8;
          auVar82._8_8_ = lVar37 + 8;
          lVar37 = auVar78._8_8_;
          auVar78._0_8_ = auVar78._0_8_ + 8;
          auVar78._8_8_ = lVar37 + 8;
          lVar37 = auVar52._8_8_;
          auVar52._0_8_ = auVar52._0_8_ + 8;
          auVar52._8_8_ = lVar37 + 8;
        } while ((uVar29 + 7 & 0xfffffffffffffff8) != uVar23);
        memset(__s_00,0xff,0x40c);
        auVar8 = _DAT_001e4dd0;
        uVar23 = 0;
        auVar39 = _DAT_001e6160;
        auVar40 = _DAT_001e6170;
        auVar41 = _DAT_001e6180;
        auVar42 = _DAT_001e6120;
        do {
          auVar52 = auVar42 ^ auVar8;
          iVar70 = -(uint)(iVar35 < auVar52._0_4_);
          auVar54._4_4_ = -(uint)(iVar84 < auVar52._4_4_);
          iVar75 = -(uint)(iVar85 < auVar52._8_4_);
          auVar54._12_4_ = -(uint)(iVar86 < auVar52._12_4_);
          auVar66._4_4_ = iVar70;
          auVar66._0_4_ = iVar70;
          auVar66._8_4_ = iVar75;
          auVar66._12_4_ = iVar75;
          auVar78 = pshuflw(in_XMM8,auVar66,0xe8);
          auVar53._4_4_ = -(uint)(auVar52._4_4_ == iVar84);
          auVar53._12_4_ = -(uint)(auVar52._12_4_ == iVar86);
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar82 = pshuflw(in_XMM9,auVar53,0xe8);
          auVar54._0_4_ = auVar54._4_4_;
          auVar54._8_4_ = auVar54._12_4_;
          auVar52 = pshuflw(auVar78,auVar54,0xe8);
          auVar79._8_4_ = 0xffffffff;
          auVar79._0_8_ = 0xffffffffffffffff;
          auVar79._12_4_ = 0xffffffff;
          auVar79 = (auVar52 | auVar82 & auVar78) ^ auVar79;
          auVar52 = packssdw(auVar79,auVar79);
          uVar22 = (unsigned_short)uVar23;
          if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_b0[uVar23] = uVar22;
          }
          auVar54 = auVar53 & auVar66 | auVar54;
          auVar52 = packssdw(auVar54,auVar54);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar52 = packssdw(auVar52 ^ auVar4,auVar52 ^ auVar4);
          if ((auVar52._0_4_ >> 0x10 & 1) != 0) {
            local_b0[uVar23 + 1] = uVar22 + 1;
          }
          auVar52 = auVar41 ^ auVar8;
          iVar70 = -(uint)(iVar35 < auVar52._0_4_);
          auVar73._4_4_ = -(uint)(iVar84 < auVar52._4_4_);
          iVar75 = -(uint)(iVar85 < auVar52._8_4_);
          auVar73._12_4_ = -(uint)(iVar86 < auVar52._12_4_);
          auVar55._4_4_ = iVar70;
          auVar55._0_4_ = iVar70;
          auVar55._8_4_ = iVar75;
          auVar55._12_4_ = iVar75;
          auVar67._4_4_ = -(uint)(auVar52._4_4_ == iVar84);
          auVar67._12_4_ = -(uint)(auVar52._12_4_ == iVar86);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar73._0_4_ = auVar73._4_4_;
          auVar73._8_4_ = auVar73._12_4_;
          auVar52 = auVar67 & auVar55 | auVar73;
          auVar52 = packssdw(auVar52,auVar52);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar52 = packssdw(auVar52 ^ auVar5,auVar52 ^ auVar5);
          if ((auVar52 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_b0[uVar23 + 2] = uVar22 + 2;
          }
          auVar56 = pshufhw(auVar55,auVar55,0x84);
          auVar43 = pshufhw(auVar67,auVar67,0x84);
          auVar83 = pshufhw(auVar56,auVar73,0x84);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar57 = (auVar83 | auVar43 & auVar56) ^ auVar57;
          auVar56 = packssdw(auVar57,auVar57);
          if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_b0[uVar23 + 3] = uVar22 + 3;
          }
          auVar56 = auVar40 ^ auVar8;
          iVar70 = -(uint)(iVar35 < auVar56._0_4_);
          auVar59._4_4_ = -(uint)(iVar84 < auVar56._4_4_);
          iVar75 = -(uint)(iVar85 < auVar56._8_4_);
          auVar59._12_4_ = -(uint)(iVar86 < auVar56._12_4_);
          auVar68._4_4_ = iVar70;
          auVar68._0_4_ = iVar70;
          auVar68._8_4_ = iVar75;
          auVar68._12_4_ = iVar75;
          auVar52 = pshuflw(auVar52,auVar68,0xe8);
          auVar58._4_4_ = -(uint)(auVar56._4_4_ == iVar84);
          auVar58._12_4_ = -(uint)(auVar56._12_4_ == iVar86);
          auVar58._0_4_ = auVar58._4_4_;
          auVar58._8_4_ = auVar58._12_4_;
          in_XMM9 = pshuflw(auVar82 & auVar78,auVar58,0xe8);
          in_XMM9 = in_XMM9 & auVar52;
          auVar59._0_4_ = auVar59._4_4_;
          auVar59._8_4_ = auVar59._12_4_;
          auVar52 = pshuflw(auVar52,auVar59,0xe8);
          auVar80._8_4_ = 0xffffffff;
          auVar80._0_8_ = 0xffffffffffffffff;
          auVar80._12_4_ = 0xffffffff;
          auVar80 = (auVar52 | in_XMM9) ^ auVar80;
          auVar52 = packssdw(auVar80,auVar80);
          if ((auVar52 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            local_b0[uVar23 + 4] = uVar22 + 4;
          }
          auVar59 = auVar58 & auVar68 | auVar59;
          auVar52 = packssdw(auVar59,auVar59);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar52 = packssdw(auVar52 ^ auVar6,auVar52 ^ auVar6);
          if ((auVar52 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            local_b0[uVar23 + 5] = uVar22 + 5;
          }
          auVar52 = auVar39 ^ auVar8;
          iVar70 = -(uint)(iVar35 < auVar52._0_4_);
          auVar74._4_4_ = -(uint)(iVar84 < auVar52._4_4_);
          iVar75 = -(uint)(iVar85 < auVar52._8_4_);
          auVar74._12_4_ = -(uint)(iVar86 < auVar52._12_4_);
          auVar60._4_4_ = iVar70;
          auVar60._0_4_ = iVar70;
          auVar60._8_4_ = iVar75;
          auVar60._12_4_ = iVar75;
          auVar69._4_4_ = -(uint)(auVar52._4_4_ == iVar84);
          auVar69._12_4_ = -(uint)(auVar52._12_4_ == iVar86);
          auVar69._0_4_ = auVar69._4_4_;
          auVar69._8_4_ = auVar69._12_4_;
          auVar74._0_4_ = auVar74._4_4_;
          auVar74._8_4_ = auVar74._12_4_;
          auVar52 = auVar69 & auVar60 | auVar74;
          auVar52 = packssdw(auVar52,auVar52);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          in_XMM8 = packssdw(auVar52 ^ auVar7,auVar52 ^ auVar7);
          if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            local_b0[uVar23 + 6] = uVar22 + 6;
          }
          auVar52 = pshufhw(auVar60,auVar60,0x84);
          auVar82 = pshufhw(auVar69,auVar69,0x84);
          auVar78 = pshufhw(auVar52,auVar74,0x84);
          auVar61._8_4_ = 0xffffffff;
          auVar61._0_8_ = 0xffffffffffffffff;
          auVar61._12_4_ = 0xffffffff;
          auVar61 = (auVar78 | auVar82 & auVar52) ^ auVar61;
          auVar52 = packssdw(auVar61,auVar61);
          if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            local_b0[uVar23 + 7] = uVar22 + 7;
          }
          uVar23 = uVar23 + 8;
          lVar37 = auVar42._8_8_;
          auVar42._0_8_ = auVar42._0_8_ + 8;
          auVar42._8_8_ = lVar37 + 8;
          lVar37 = auVar41._8_8_;
          auVar41._0_8_ = auVar41._0_8_ + 8;
          auVar41._8_8_ = lVar37 + 8;
          lVar37 = auVar40._8_8_;
          auVar40._0_8_ = auVar40._0_8_ + 8;
          auVar40._8_8_ = lVar37 + 8;
          lVar37 = auVar39._8_8_;
          auVar39._0_8_ = auVar39._0_8_ + 8;
          auVar39._8_8_ = lVar37 + 8;
        } while ((uVar29 + 7 & 0x1fffffff8) != uVar23);
      }
      if (local_1a8 != 0) {
        uVar29 = local_1a8 - 1;
        lVar37 = 0;
        uVar28 = 0;
        uVar23 = local_200;
        pLVar26 = local_1b0;
        uVar24 = uVar32;
        uVar34 = local_1a8;
        puVar18 = local_208;
LAB_001a4cf9:
        uVar31 = uVar32;
        if (uVar23 < uVar32) {
          uVar31 = uVar23;
        }
        bVar38 = uVar28 == uVar29;
        inpos = uVar28 * uVar24;
        insize_00 = inpos + uVar24;
        if (uVar23 <= inpos + uVar24) {
          insize_00 = uVar23;
        }
        if (pLVar26->btype == 2) {
          local_1b8 = CONCAT44(local_1b8._4_4_,(uint)bVar38);
          local_c8 = (undefined1  [16])0x0;
          local_b8 = 0;
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_cl.tree2d = (uint *)0x0;
          tree_cl.tree1d = (uint *)0x0;
          tree_cl.lengths = (uint *)0x0;
          local_138 = (undefined1  [16])0x0;
          local_128 = 0;
          local_1f8 = (undefined1  [16])0x0;
          local_1e8 = 0;
          local_88 = (undefined1  [16])0x0;
          local_78 = 0;
          if (pLVar26->use_lz77 == 0) {
            local_1d0 = uVar32;
            local_1a0 = uVar28;
            uVar13 = uivector_resize((uivector *)local_c8,insize_00 - inpos);
            if (uVar13 == 0) {
              local_210 = (uint *)CONCAT44(local_210._4_4_,0x53);
              goto LAB_001a5312;
            }
            if (inpos < insize_00) {
              do {
                *(uint *)(local_c8._0_8_ + inpos * 4) = (uint)local_208[inpos];
                inpos = inpos + 1;
              } while (uVar31 != inpos);
            }
LAB_001a4f48:
            puVar19 = (uint *)calloc(1,0x478);
            local_210 = (uint *)CONCAT44(local_210._4_4_,0x53);
            if (puVar19 == (uint *)0x0) goto LAB_001a5312;
            puVar20 = (uint *)calloc(1,0x78);
            if (puVar20 == (uint *)0x0) goto LAB_001a5315;
            if (local_c8._8_8_ != 0) {
              sVar25 = 0;
              do {
                uVar13 = *(uint *)(local_c8._0_8_ + sVar25 * 4);
                puVar19[uVar13] = puVar19[uVar13] + 1;
                if (0x100 < (ulong)uVar13) {
                  puVar20[*(uint *)(local_c8._0_8_ + (sVar25 + 2) * 4)] =
                       puVar20[*(uint *)(local_c8._0_8_ + (sVar25 + 2) * 4)] + 1;
                  sVar25 = sVar25 + 3;
                }
                sVar25 = sVar25 + 1;
              } while (sVar25 != local_c8._8_8_);
            }
            puVar19[0x100] = 1;
            uVar13 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar19,0x101,0x11e,0xf);
            if ((uVar13 == 0) &&
               (uVar13 = HuffmanTree_makeFromFrequencies(&tree_d,puVar20,2,0x1e,0xf),
               uVar14 = tree_d.numcodes, puVar21 = tree_ll.lengths, uVar13 == 0)) {
              local_a8 = 0x11e;
              if (tree_ll.numcodes < 0x11e) {
                local_a8 = (ulong)tree_ll.numcodes;
              }
              local_198 = 0x1e;
              if (tree_d.numcodes < 0x1e) {
                local_198 = (ulong)tree_d.numcodes;
              }
              local_1c8 = puVar18;
              local_190 = puVar20;
              local_188 = puVar19;
              if (tree_ll.numcodes != 0) {
                uVar32 = 0;
                do {
                  uVar13 = puVar21[uVar32];
                  uVar15 = uivector_resize((uivector *)local_138,local_138._8_8_ + 1);
                  if (uVar15 != 0) {
                    *(uint *)(local_138._0_8_ + (local_138._8_8_ - 1) * 4) = uVar13;
                  }
                  uVar32 = uVar32 + 1;
                } while (local_a8 != uVar32);
              }
              puVar19 = tree_d.lengths;
              if (uVar14 != 0) {
                uVar32 = 0;
                do {
                  uVar13 = puVar19[uVar32];
                  uVar14 = uivector_resize((uivector *)local_138,local_138._8_8_ + 1);
                  if (uVar14 != 0) {
                    *(uint *)(local_138._0_8_ + (local_138._8_8_ - 1) * 4) = uVar13;
                  }
                  uVar32 = uVar32 + 1;
                } while (local_198 != uVar32);
              }
              uVar32 = (ulong)(uint)local_138._8_4_;
              puVar18 = local_1c8;
              if (uVar32 != 0) {
                uVar10 = local_138._0_8_;
                uVar23 = 0;
                do {
                  uVar28 = uVar23 + 1;
                  uVar13 = *(uint *)(uVar10 + uVar23 * 4);
                  if (uVar28 < uVar32) {
                    uVar34 = 0;
                    uVar24 = uVar28;
                    do {
                      if (*(uint *)(uVar10 + uVar24 * 4) != uVar13) break;
                      uVar34 = (ulong)((int)uVar34 + 1);
                      uVar24 = uVar28 + uVar34;
                    } while (uVar24 < uVar32);
                    uVar14 = (uint)uVar34;
                    if (uVar14 < 2 || uVar13 != 0) {
                      puVar18 = local_1c8;
                      if (uVar14 < 3) goto LAB_001a55d3;
                      uVar15 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                      if (uVar15 != 0) {
                        *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar13;
                      }
                      uVar28 = uVar34 / 6;
                      if (5 < uVar14) {
                        do {
                          uVar13 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                          if (uVar13 != 0) {
                            *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 0x10;
                          }
                          uVar13 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                          if (uVar13 != 0) {
                            *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 3;
                          }
                          uVar28 = uVar28 - 1;
                        } while (uVar28 != 0);
                      }
                      uVar13 = uVar14 + (int)(uVar34 / 6) * -6;
                      if (uVar13 < 3) {
                        uVar34 = (ulong)(uVar14 - uVar13);
                      }
                      else {
                        uVar14 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar14 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 0x10;
                        }
                        uVar14 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar14 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar13 - 3;
                        }
                      }
                    }
                    else {
                      uVar13 = uVar14 + 1;
                      if (uVar13 < 0xb) {
                        uVar13 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar13 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 0x11;
                        }
                        uVar13 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar13 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar14 - 2;
                        }
                      }
                      else {
                        if (0x89 < uVar13) {
                          uVar13 = 0x8a;
                        }
                        uVar14 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar14 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = 0x12;
                        }
                        uVar14 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                        if (uVar14 != 0) {
                          *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar13 - 0xb;
                        }
                        uVar34 = (ulong)(uVar13 - 1);
                      }
                    }
                    uVar23 = uVar23 + uVar34;
                    puVar18 = local_1c8;
                  }
                  else {
LAB_001a55d3:
                    uVar14 = uivector_resize((uivector *)local_1f8,local_1f8._8_8_ + 1);
                    if (uVar14 != 0) {
                      *(uint *)(local_1f8._0_8_ + (local_1f8._8_8_ - 1) * 4) = uVar13;
                    }
                  }
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar32);
              }
              puVar21 = (uint *)calloc(1,0x4c);
              puVar19 = local_188;
              puVar20 = local_190;
              pLVar26 = local_1b0;
              if (puVar21 == (uint *)0x0) {
                puVar21 = (uint *)0x0;
                uVar34 = local_1a8;
              }
              else {
                uVar10 = local_1f8._8_8_;
                if (local_1f8._8_8_ != 0) {
                  sVar25 = 0;
                  do {
                    uVar13 = *(uint *)(local_1f8._0_8_ + sVar25 * 4);
                    puVar21[uVar13] = puVar21[uVar13] + 1;
                    sVar25 = (sVar25 - ((ulong)uVar13 < 0x10)) + 2;
                  } while (sVar25 != local_1f8._8_8_);
                }
                uVar13 = HuffmanTree_makeFromFrequencies(&tree_cl,puVar21,0x13,0x13,7);
                if (uVar13 == 0) {
                  uVar32 = (ulong)tree_cl.numcodes;
                  uVar13 = uivector_resize((uivector *)local_88,uVar32);
                  pLVar26 = local_1b0;
                  uVar34 = local_1a8;
                  if (uVar13 != 0) {
                    if (uVar32 != 0) {
                      lVar30 = 0;
                      do {
                        *(uint *)(local_88._0_8_ + lVar30) =
                             tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar30)];
                        lVar30 = lVar30 + 4;
                      } while (uVar32 << 2 != lVar30);
                    }
                    do {
                      auVar8 = local_88;
                      sVar33 = local_1d8;
                      sVar25 = local_228.size;
                      uVar9 = local_88._0_8_;
                      if (((ulong)local_88._8_8_ < 5) ||
                         (*(uint *)(local_88._0_8_ + (local_88._8_8_ - 1) * 4) != 0)) {
                        iVar70 = (int)local_1b8;
                        local_70 = puVar21;
                        if ((local_1d8 & 7) == 0) {
                          sVar27 = local_228.size + 1;
                          uVar13 = ucvector_reserve(&local_228,sVar27);
                          iVar70 = (int)local_1b8;
                          if (uVar13 != 0) {
                            local_228.data[sVar25] = '\0';
                            local_228.size = sVar27;
                          }
                        }
                        sVar25 = local_228.size;
                        local_228.data[local_228.size - 1] =
                             local_228.data[local_228.size - 1] |
                             (byte)(iVar70 << ((byte)sVar33 & 7));
                        if (((int)sVar33 + 1U & 7) == 0) {
                          sVar27 = local_228.size + 1;
                          uVar13 = ucvector_reserve(&local_228,sVar27);
                          if (uVar13 != 0) {
                            local_228.data[sVar25] = '\0';
                            local_228.size = sVar27;
                          }
                        }
                        sVar25 = local_228.size;
                        if ((sVar33 + 2 & 7) == 0) {
                          sVar27 = local_228.size + 1;
                          uVar13 = ucvector_reserve(&local_228,sVar27);
                          if (uVar13 != 0) {
                            local_228.data[sVar25] = '\0';
                            local_228.size = sVar27;
                          }
                        }
                        local_228.data[local_228.size - 1] =
                             local_228.data[local_228.size - 1] | '\x01' << ((byte)(sVar33 + 2) & 7)
                        ;
                        local_1d8 = sVar33 + 3;
                        iVar70 = auVar8._8_4_;
                        uVar23 = (ulong)(iVar70 - 4) + 3;
                        uVar32 = 0;
                        goto LAB_001a59a6;
                      }
                      uVar13 = uivector_resize((uivector *)local_88,local_88._8_8_ - 1);
                      puVar20 = local_190;
                      uVar34 = local_1a8;
                      puVar19 = local_188;
                      puVar18 = local_1c8;
                    } while (uVar13 != 0);
                  }
                }
                else {
                  local_210 = (uint *)CONCAT44(local_210._4_4_,uVar13);
                  uVar34 = local_1a8;
                }
              }
            }
            else {
              puVar21 = (uint *)0x0;
              local_210 = (uint *)CONCAT44(local_210._4_4_,uVar13);
            }
          }
          else {
            local_1d0 = uVar32;
            local_1a0 = uVar28;
            uVar13 = encodeLZ77((uivector *)local_c8,&local_60,local_208,inpos,insize_00,
                                pLVar26->windowsize,pLVar26->minmatch,pLVar26->nicematch,
                                pLVar26->lazymatching);
            if (uVar13 == 0) goto LAB_001a4f48;
            local_210 = (uint *)CONCAT44(local_210._4_4_,uVar13);
LAB_001a5312:
            puVar19 = (uint *)0x0;
LAB_001a5315:
            puVar21 = (uint *)0x0;
            puVar20 = (uint *)0x0;
          }
          goto LAB_001a531a;
        }
        uVar14 = 0;
        if (pLVar26->btype == 1) {
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_ll.lengths = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          local_210 = (uint *)uVar31;
          local_1d0 = uVar32;
          local_1c8 = puVar18;
          local_1a0 = uVar28;
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&tree_d);
          sVar33 = local_1d8;
          sVar25 = local_228.size;
          puVar18 = local_228.data;
          if ((local_1d8 & 7) == 0) {
            uVar32 = local_228.size + 1;
            if (local_228.allocsize < uVar32) {
              local_198 = uVar32 * 3 >> 1;
              if (local_228.allocsize * 2 < uVar32) {
                local_198 = uVar32;
              }
              local_1b8 = uVar32;
              puVar17 = (uchar *)realloc(local_228.data,local_198);
              if (puVar17 == (uchar *)0x0) goto LAB_001a503a;
              local_228.allocsize = local_198;
              uVar32 = local_1b8;
              local_228.data = puVar17;
            }
            local_228.data[uVar32 - 1] = '\0';
            puVar18 = local_228.data;
            sVar25 = uVar32;
            local_228.size = uVar32;
          }
LAB_001a503a:
          sVar27 = local_228.size;
          puVar17 = local_228.data;
          puVar18[sVar25 - 1] = puVar18[sVar25 - 1] | bVar38 << ((byte)sVar33 & 7);
          uVar32 = sVar27;
          if ((sVar33 + 1 & 7) == 0) {
            uVar32 = local_228.size + 1;
            if (local_228.allocsize < uVar32) {
              local_198 = uVar32 * 3 >> 1;
              if (local_228.allocsize * 2 < uVar32) {
                local_198 = uVar32;
              }
              local_1b8 = uVar32;
              puVar18 = (uchar *)realloc(local_228.data,local_198);
              uVar32 = sVar27;
              if (puVar18 == (uchar *)0x0) goto LAB_001a50c3;
              local_228.allocsize = local_198;
              uVar32 = local_1b8;
              local_228.data = puVar18;
            }
            local_228.data[uVar32 - 1] = '\0';
            puVar17 = local_228.data;
            local_228.size = uVar32;
          }
LAB_001a50c3:
          sVar25 = local_228.size;
          puVar17[uVar32 - 1] = puVar17[uVar32 - 1] | '\x01' << ((byte)(sVar33 + 1) & 7);
          if (((int)sVar33 + 2U & 7) == 0) {
            uVar23 = local_228.size + 1;
            puVar18 = local_228.data;
            uVar32 = local_228.allocsize;
            if (local_228.allocsize < uVar23) {
              uVar32 = uVar23 * 3 >> 1;
              if (local_228.allocsize * 2 < uVar23) {
                uVar32 = uVar23;
              }
              puVar18 = (uchar *)realloc(local_228.data,uVar32);
              if (puVar18 == (uchar *)0x0) goto LAB_001a5130;
            }
            local_228.allocsize = uVar32;
            local_228.data = puVar18;
            local_228.data[sVar25] = '\0';
            local_228.size = uVar23;
          }
LAB_001a5130:
          puVar19 = tree_ll.lengths;
          puVar18 = local_1c8;
          local_1d8 = sVar33 + 3;
          if (local_1b0->use_lz77 == 0) {
            puVar20 = tree_ll.tree1d;
            if (inpos < insize_00) {
              lVar30 = (long)local_210 + lVar37;
              lVar36 = 0;
              do {
                addHuffmanSymbol(&local_1d8,&local_228,puVar20[puVar18[lVar36]],
                                 puVar19[puVar18[lVar36]]);
                lVar36 = lVar36 + 1;
              } while (lVar30 != lVar36);
            }
LAB_001a5281:
            addHuffmanSymbol(&local_1d8,&local_228,puVar20[0x100],puVar19[0x100]);
            uVar14 = 0;
          }
          else {
            tree_cl.tree2d = (uint *)0x0;
            tree_cl.tree1d = (uint *)0x0;
            tree_cl.lengths = (uint *)0x0;
            uVar14 = encodeLZ77((uivector *)&tree_cl,&local_60,local_208,inpos,insize_00,
                                local_1b0->windowsize,local_1b0->minmatch,local_1b0->nicematch,
                                local_1b0->lazymatching);
            puVar18 = local_1c8;
            if (uVar14 == 0) {
              writeLZ77data(&local_1d8,&local_228,(uivector *)&tree_cl,&tree_ll,&tree_d);
              free(tree_cl.tree2d);
              puVar20 = tree_ll.tree1d;
              puVar19 = tree_ll.lengths;
              goto LAB_001a5281;
            }
            free(tree_cl.tree2d);
            puVar20 = tree_ll.tree1d;
            puVar19 = tree_ll.lengths;
          }
          free(tree_ll.tree2d);
          free(puVar20);
          free(puVar19);
          free(tree_d.tree2d);
          free(tree_d.tree1d);
          free(tree_d.lengths);
          uVar32 = local_1d0;
          uVar23 = local_200;
          pLVar26 = local_1b0;
          uVar28 = local_1a0;
          uVar24 = local_1c0;
          uVar34 = local_1a8;
        }
        goto LAB_001a53f3;
      }
      uVar14 = 0;
LAB_001a5b63:
      free(local_68);
      free(local_a0);
      free(local_90);
      free(local_98);
      free(__s_00);
      free(local_b0);
      outsize = local_180;
    }
  }
LAB_001a5bc5:
  *out = local_228.data;
  *outsize = local_228.size;
  return uVar14;
  while (uVar24 = uVar23 & 0xffffffff, uVar23 = uVar23 - 1, uVar32 = uVar28 + 1,
        *(uint *)(uVar9 + uVar24 * 4) == 0) {
LAB_001a59a6:
    uVar28 = uVar32;
    if (uVar28 == iVar70 - 4) break;
  }
  iVar75 = (int)(uVar28 + 1);
  local_210 = (uint *)CONCAT44(local_210._4_4_,(iVar70 - iVar75) + -3);
  iVar35 = (int)local_198;
  local_1b8 = CONCAT44(local_1b8._4_4_,iVar70 + 1);
  addBitsToStream(&local_1d8,&local_228,(int)local_a8 - 0x101,5);
  addBitsToStream(&local_1d8,&local_228,iVar35 - 1,5);
  addBitsToStream(&local_1d8,&local_228,(uint)local_210,4);
  if ((int)local_1b8 != iVar75) {
    uVar32 = 0;
    do {
      addBitsToStream(&local_1d8,&local_228,*(uint *)(uVar9 + uVar32 * 4),3);
      uVar32 = uVar32 + 1;
    } while ((uint)(iVar70 - (int)uVar28) != uVar32);
  }
  if (uVar10 != 0) {
    uVar9 = local_1f8._0_8_;
    puVar19 = tree_cl.tree1d;
    local_210 = tree_cl.lengths;
    sVar25 = 0;
    do {
      addHuffmanSymbol(&local_1d8,&local_228,puVar19[*(uint *)(uVar9 + sVar25 * 4)],
                       local_210[*(uint *)(uVar9 + sVar25 * 4)]);
      puVar20 = (uint *)(uVar9 + sVar25 * 4);
      if (*puVar20 - 0x10 < 3) {
        lVar30 = sVar25 + 1;
        sVar25 = sVar25 + 1;
        addBitsToStream(&local_1d8,&local_228,*(uint *)(uVar9 + lVar30 * 4),
                        *(size_t *)(&DAT_0023e0f0 + (ulong)(*puVar20 - 0x10) * 8));
      }
      sVar25 = sVar25 + 1;
    } while (sVar25 != uVar10);
  }
  writeLZ77data(&local_1d8,&local_228,(uivector *)local_c8,&tree_ll,&tree_d);
  puVar21 = local_70;
  if (tree_ll.lengths[0x100] == 0) {
    local_210 = (uint *)CONCAT44(local_210._4_4_,0x40);
    pLVar26 = local_1b0;
    puVar20 = local_190;
    uVar34 = local_1a8;
    puVar19 = local_188;
    puVar18 = local_1c8;
  }
  else {
    addHuffmanSymbol(&local_1d8,&local_228,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]);
    local_210 = (uint *)((ulong)local_210 & 0xffffffff00000000);
    pLVar26 = local_1b0;
    puVar20 = local_190;
    uVar34 = local_1a8;
    puVar19 = local_188;
    puVar18 = local_1c8;
  }
LAB_001a531a:
  free((void *)local_c8._0_8_);
  free(tree_ll.tree2d);
  free(tree_ll.tree1d);
  free(tree_ll.lengths);
  free(tree_d.tree2d);
  free(tree_d.tree1d);
  free(tree_d.lengths);
  free(tree_cl.tree2d);
  free(tree_cl.tree1d);
  free(tree_cl.lengths);
  free(puVar19);
  free(puVar20);
  free(puVar21);
  free((void *)local_1f8._0_8_);
  free((void *)local_138._0_8_);
  free((void *)local_88._0_8_);
  uVar32 = local_1d0;
  uVar23 = local_200;
  uVar28 = local_1a0;
  uVar24 = local_1c0;
  uVar14 = (uint)local_210;
LAB_001a53f3:
  uVar28 = uVar28 + 1;
  if (uVar28 == uVar34) goto LAB_001a5b63;
  uVar32 = uVar32 + uVar24;
  lVar37 = lVar37 - uVar24;
  puVar18 = puVar18 + uVar24;
  if (uVar14 != 0) goto LAB_001a5b63;
  goto LAB_001a4cf9;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}